

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinEPC17_1>
               (int N,const_host_buffer_type rho,host_buffer_type eps)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar1 = rho[uVar2];
      dVar3 = 0.0;
      if (1e-24 < dVar1) {
        dVar3 = (double)(~-(ulong)(dVar1 * 0.5 <= 1e-24) &
                        (ulong)((-1.0 / ((2.35 - SQRT(dVar1 * dVar1) * 2.4 * 0.5) +
                                        dVar1 * dVar1 * 3.2 * 0.25)) * dVar1 * 0.25));
      }
      eps[uVar2] = dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return;
}

Assistant:

LDA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    traits::eval_exc_unpolar( rho[i], eps[i] );

  }

}